

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int add_base128_integer(CBB *cbb,uint64_t v)

{
  int iVar1;
  byte local_35;
  uint local_34;
  uint8_t byte;
  uint64_t uStack_30;
  uint i;
  uint64_t copy;
  uint len_len;
  uint64_t v_local;
  CBB *cbb_local;
  
  copy._4_4_ = 0;
  for (uStack_30 = v; uStack_30 != 0; uStack_30 = uStack_30 >> 7) {
    copy._4_4_ = copy._4_4_ + 1;
  }
  local_34 = copy._4_4_;
  if (copy._4_4_ == 0) {
    copy._4_4_ = 1;
    local_34 = copy._4_4_;
  }
  do {
    local_34 = local_34 - 1;
    if (copy._4_4_ <= local_34) {
      return 1;
    }
    local_35 = (byte)(v >> ((char)local_34 * '\a' & 0x3fU)) & 0x7f;
    if (local_34 != 0) {
      local_35 = local_35 | 0x80;
    }
    iVar1 = CBB_add_u8(cbb,local_35);
  } while (iVar1 != 0);
  return 0;
}

Assistant:

static int add_base128_integer(CBB *cbb, uint64_t v) {
  unsigned len_len = 0;
  uint64_t copy = v;
  while (copy > 0) {
    len_len++;
    copy >>= 7;
  }
  if (len_len == 0) {
    len_len = 1;  // Zero is encoded with one byte.
  }
  for (unsigned i = len_len - 1; i < len_len; i--) {
    uint8_t byte = (v >> (7 * i)) & 0x7f;
    if (i != 0) {
      // The high bit denotes whether there is more data.
      byte |= 0x80;
    }
    if (!CBB_add_u8(cbb, byte)) {
      return 0;
    }
  }
  return 1;
}